

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Service_Request_PDU::Decode
          (Service_Request_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *pKVar2;
  KDataStream *pKVar3;
  int iVar4;
  undefined1 local_98 [8];
  Supplies sup;
  undefined1 local_78 [4];
  KUINT16 i;
  undefined1 local_55;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Service_Request_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar4 = 0;
  if ((local_19 & 1) != 0) {
    iVar4 = 0xc;
  }
  if ((uint)KVar1 + iVar4 < 0x1c) {
    local_55 = 1;
    pKVar2 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(pKVar2,&local_40,2);
    local_55 = 0;
    __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
  }
  Logistics_Header::Decode((Logistics_Header *)this,pKStack_18,(bool)(local_19 & 1));
  pKVar3 = KDataStream::operator>>(pKStack_18,&this->m_ui8ServiceTypeRequested);
  pKVar3 = KDataStream::operator>>(pKVar3,&(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes);
  KDataStream::operator>>(pKVar3,&(this->super_Resupply_Received_PDU).m_ui16Padding1);
  KVar1 = KDataStream::GetBufferSize(pKStack_18);
  if (KVar1 < (ushort)((ushort)(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes * 0xc)) {
    sup._22_1_ = 1;
    pKVar2 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,"Decode",(allocator<char> *)&sup.field_0x17);
    KException::KException(pKVar2,(KString *)local_78,0x1c);
    sup._22_1_ = 0;
    __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
  }
  for (sup._20_2_ = 0;
      (ushort)sup._20_2_ < (ushort)(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes;
      sup._20_2_ = sup._20_2_ + 1) {
    DATA_TYPE::Supplies::Supplies((Supplies *)local_98);
    DATA_TYPE::operator>>(pKStack_18,(DataTypeBase *)local_98);
    std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::push_back
              (&(this->super_Resupply_Received_PDU).m_vSupplies,(value_type *)local_98);
    DATA_TYPE::Supplies::~Supplies((Supplies *)local_98);
  }
  return;
}

Assistant:

void Service_Request_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SERVICE_REQUEST_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Logistics_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8ServiceTypeRequested
           >> m_ui8NumSupplyTypes
           >> m_ui16Padding1;

    // Now recheck the size of the packet as we now know the number of supply types.
    if( stream.GetBufferSize() < m_ui8NumSupplyTypes * Supplies::SUPPLIES_SIZE )throw KException( __FUNCTION__, RESUPPLY_RECEIVED_PDU_SIZE );

    for( KUINT16 i = 0; i < m_ui8NumSupplyTypes; ++i )
    {
        Supplies sup;
        stream >> KDIS_STREAM sup;
        m_vSupplies.push_back( sup );
    }
}